

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Vec_Int_t * Saig_RefManFindReason(Saig_RefMan_t *p)

{
  ulong uVar1;
  Aig_Man_t *p_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_01;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  bool local_69;
  int iPrio1;
  int iPrio0;
  int fPhase1;
  int fPhase0;
  int iFrame;
  int iInput;
  int CountPrios;
  int i;
  Vec_Int_t *vReasons;
  Vec_Int_t *vPi2Prio;
  Vec_Int_t *vPrios;
  Aig_Obj_t *pObj;
  Saig_RefMan_t *p_local;
  
  iVar2 = Saig_ManPiNum(p->pAig);
  pVVar7 = Vec_IntStartFull(iVar2);
  iVar2 = Aig_ManObjNumMax(p->pFrames);
  p_01 = Vec_IntStartFull(iVar2);
  iFrame = 0;
  pAVar8 = Aig_ManConst1(p->pFrames);
  *(ulong *)&pAVar8->field_0x18 = *(ulong *)&pAVar8->field_0x18 & 0xfffffffffffffff7 | 8;
  for (iInput = 0; iVar2 = Vec_PtrSize(p->pFrames->vCis), iInput < iVar2; iInput = iInput + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->pFrames->vCis,iInput);
    iVar2 = Vec_IntEntry(p->vMapPiF2A,iInput << 1);
    iVar4 = Vec_IntEntry(p->vMapPiF2A,iInput * 2 + 1);
    uVar6 = Abc_InfoHasBit((uint *)(p->pCex + 1),p->pCex->nRegs + p->pCex->nPis * iVar4 + iVar2);
    *(ulong *)&pAVar8->field_0x18 =
         *(ulong *)&pAVar8->field_0x18 & 0xfffffffffffffff7 | ((ulong)uVar6 & 1) << 3;
    iVar4 = Vec_IntEntry(pVVar7,iVar2);
    if (iVar4 == -1) {
      Vec_IntWriteEntry(pVVar7,iVar2,iFrame);
      iFrame = iFrame + 1;
    }
    iVar2 = Aig_ObjId(pAVar8);
    Vec_IntWriteEntry(p_01,iVar2,iInput);
  }
  Vec_IntFree(pVVar7);
  for (iInput = 0; iVar2 = Vec_PtrSize(p->pFrames->vObjs), iInput < iVar2; iInput = iInput + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->pFrames->vObjs,iInput);
    if ((pAVar8 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar8), iVar2 != 0)) {
      uVar6 = Aig_ObjFaninC0(pAVar8);
      pAVar9 = Aig_ObjFanin0(pAVar8);
      uVar6 = uVar6 ^ (uint)(*(ulong *)&pAVar9->field_0x18 >> 3) & 1;
      uVar3 = Aig_ObjFaninC1(pAVar8);
      pAVar9 = Aig_ObjFanin1(pAVar8);
      uVar3 = uVar3 ^ (uint)(*(ulong *)&pAVar9->field_0x18 >> 3) & 1;
      iVar2 = Aig_ObjFaninId0(pAVar8);
      iVar2 = Vec_IntEntry(p_01,iVar2);
      iVar4 = Aig_ObjFaninId1(pAVar8);
      iVar4 = Vec_IntEntry(p_01,iVar4);
      local_69 = uVar6 != 0 && uVar3 != 0;
      *(ulong *)&pAVar8->field_0x18 =
           *(ulong *)&pAVar8->field_0x18 & 0xfffffffffffffff7 | (ulong)local_69 << 3;
      if ((uVar6 == 0) || (uVar3 == 0)) {
        if ((uVar6 == 0) && (uVar3 != 0)) {
          iVar4 = Aig_ObjId(pAVar8);
          Vec_IntWriteEntry(p_01,iVar4,iVar2);
        }
        else if ((uVar6 == 0) || (uVar3 != 0)) {
          iVar5 = Aig_ObjId(pAVar8);
          iVar2 = Abc_MinInt(iVar2,iVar4);
          Vec_IntWriteEntry(p_01,iVar5,iVar2);
        }
        else {
          iVar2 = Aig_ObjId(pAVar8);
          Vec_IntWriteEntry(p_01,iVar2,iVar4);
        }
      }
      else {
        iVar5 = Aig_ObjId(pAVar8);
        iVar2 = Abc_MaxInt(iVar2,iVar4);
        Vec_IntWriteEntry(p_01,iVar5,iVar2);
      }
    }
  }
  pAVar8 = Aig_ManCo(p->pFrames,0);
  pAVar9 = Aig_ObjFanin0(pAVar8);
  uVar1 = *(ulong *)&pAVar9->field_0x18;
  uVar6 = Aig_ObjFaninC0(pAVar8);
  if (((uint)(uVar1 >> 3) & 1) != uVar6) {
    __assert_fail("(int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                  ,0xd5,"Vec_Int_t *Saig_RefManFindReason(Saig_RefMan_t *)");
  }
  pVVar7 = Vec_IntAlloc(100);
  Aig_ManIncrementTravId(p->pFrames);
  pAVar9 = Aig_ObjFanin0(pAVar8);
  iVar2 = Aig_ObjIsConst1(pAVar9);
  if (iVar2 == 0) {
    p_00 = p->pFrames;
    pAVar8 = Aig_ObjFanin0(pAVar8);
    Saig_RefManFindReason_rec(p_00,pAVar8,p_01,pVVar7);
  }
  Vec_IntFree(p_01);
  return pVVar7;
}

Assistant:

Vec_Int_t * Saig_RefManFindReason( Saig_RefMan_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vPi2Prio, * vReasons;
    int i, CountPrios;

    vPi2Prio = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    vPrios   = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );

    // set PI values according to CEX
    CountPrios = 0;
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // assign priority
        if ( Vec_IntEntry(vPi2Prio, iInput) == ~0 )
            Vec_IntWriteEntry( vPi2Prio, iInput, CountPrios++ );
//        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Vec_IntEntry(vPi2Prio, iInput) );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }
//    printf( "Priority numbers = %d.\n", CountPrios );
    Vec_IntFree( vPi2Prio );

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    assert( (int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj) );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        Saig_RefManFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
    return vReasons;
}